

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O2

void __thiscall Timer::~Timer(Timer *this)

{
  LOCK();
  (this->tm_running)._M_base._M_i = false;
  UNLOCK();
  std::condition_variable::notify_all();
  if ((this->tm_tick_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::
  _Hashtable<int,_std::pair<const_int,_Timer::IdState>,_std::allocator<std::pair<const_int,_Timer::IdState>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_Timer::IdState>,_std::allocator<std::pair<const_int,_Timer::IdState>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&this->tm_id_state_map);
  Threadpool::~Threadpool(&this->tm_thread_pool);
  std::thread::~thread(&this->tm_tick_thread);
  std::condition_variable::~condition_variable(&this->tm_cond);
  std::vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>::~vector
            ((vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_> *)this);
  return;
}

Assistant:

~Timer()
    {
        tm_running.store(false);
        tm_cond.notify_all();
        if(tm_tick_thread.joinable())
        {
            tm_tick_thread.join();
        }
    }